

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O1

int default_stream_scheduler_can_send
              (quicly_stream_scheduler_t *self,quicly_conn_t *conn,int conn_is_saturated)

{
  st_quicly_default_scheduler_state_t *psVar1;
  quicly_linklist_t *pqVar2;
  st_quicly_linklist_t *psVar3;
  
  psVar1 = &(conn->super)._default_scheduler;
  if ((conn_is_saturated == 0) &&
     (pqVar2 = &(conn->super)._default_scheduler.blocked,
     (conn->super)._default_scheduler.blocked.prev != pqVar2)) {
    ((conn->super)._default_scheduler.blocked.next)->prev = &psVar1->active;
    psVar3 = (conn->super)._default_scheduler.blocked.prev;
    psVar3->next = (conn->super)._default_scheduler.active.next;
    ((conn->super)._default_scheduler.active.next)->prev = psVar3;
    (conn->super)._default_scheduler.active.next = (conn->super)._default_scheduler.blocked.next;
    (conn->super)._default_scheduler.blocked.next = pqVar2;
    (conn->super)._default_scheduler.blocked.prev = pqVar2;
  }
  return (int)((st_quicly_default_scheduler_state_t *)(psVar1->active).prev != psVar1);
}

Assistant:

static int default_stream_scheduler_can_send(quicly_stream_scheduler_t *self, quicly_conn_t *conn, int conn_is_saturated)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)conn)->_default_scheduler;

    if (!conn_is_saturated) {
        /* not saturated */
        quicly_linklist_insert_list(&sched->active, &sched->blocked);
    } else {
        /* The code below is disabled, because H2O's scheduler doesn't allow you to "walk" the priority tree without actually
         * running the round robin, and we want quicly's default to behave like H2O so that we can catch errors.  The downside is
         * that there'd be at most one spurious call of `quicly_send` when the connection is saturated, but that should be fine.
         */
        if (0) {
            /* Saturated. Lazily move such streams to the "blocked" list, at the same time checking if anything can be sent. */
            while (quicly_linklist_is_linked(&sched->active)) {
                quicly_stream_t *stream =
                    (void *)((char *)sched->active.next - offsetof(quicly_stream_t, _send_aux.pending_link.default_scheduler));
                if (quicly_stream_can_send(stream, 0))
                    return 1;
                quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
                quicly_linklist_insert(sched->blocked.prev, &stream->_send_aux.pending_link.default_scheduler);
            }
        }
    }

    return quicly_linklist_is_linked(&sched->active);
}